

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_failure_tests.cpp
# Opt level: O0

void __thiscall
iu_NoFatalFailureTest_x_iutest_x_Expect_Test::Body
          (iu_NoFatalFailureTest_x_iutest_x_Expect_Test *this)

{
  bool bVar1;
  int iVar2;
  AssertionHelper local_af0;
  Fixed local_ac0;
  AssertionHelper local_938;
  Fixed local_908;
  undefined1 local_780 [8];
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  iutest_failure_checker_3;
  Fixed local_730;
  undefined1 local_5a8 [8];
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  iutest_failure_checker_2;
  Fixed local_558;
  AssertionHelper local_3d0;
  Fixed local_3a0;
  undefined1 local_218 [8];
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  iutest_failure_checker_1;
  Fixed local_1c8;
  int local_40;
  undefined1 local_30 [8];
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  iutest_failure_checker;
  iu_NoFatalFailureTest_x_iutest_x_Expect_Test *this_local;
  
  iutest_failure_checker._24_8_ = this;
  iutest::detail::AlwaysZero();
  bVar1 = iutest::detail::AlwaysTrue();
  if (bVar1) {
    iutest::detail::NewTestPartResultCheckHelper::
    Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
    ::Counter((Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
               *)local_30);
    iutest::detail::AlwaysTrue();
    iVar2 = iutest::detail::NewTestPartResultCheckHelper::
            Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
            ::count((Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
                     *)local_30);
    if (iVar2 < 1) {
      local_40 = 0;
    }
    else {
      local_40 = 3;
    }
    iutest::detail::NewTestPartResultCheckHelper::
    Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
    ::~Counter((Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
                *)local_30);
    if (local_40 != 0) goto LAB_003c24ee;
  }
  else {
LAB_003c24ee:
    memset(&local_1c8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1c8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_failure_checker_1.field_0x18,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
               ,0x26,"\nExpected: ; doesn\'t generate new fatal failure.\n  Actual: it does.",
               kNonFatalFailure);
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker_1.field_0x18,&local_1c8);
    iutest::AssertionHelper::~AssertionHelper
              ((AssertionHelper *)&iutest_failure_checker_1.field_0x18);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1c8);
  }
  iutest::detail::AlwaysZero();
  bVar1 = iutest::detail::AlwaysTrue();
  if (bVar1) {
    iutest::detail::NewTestPartResultCheckHelper::
    Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
    ::Counter((Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
               *)local_218);
    bVar1 = iutest::detail::AlwaysTrue();
    if (bVar1) {
      memset(&local_3a0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3a0);
      iutest::AssertionHelper::AssertionHelper
                (&local_3d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
                 ,0x27,"Succeeded.\n",kSuccess);
      iutest::AssertionHelper::operator=(&local_3d0,&local_3a0);
      iutest::AssertionHelper::~AssertionHelper(&local_3d0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3a0);
    }
    iVar2 = iutest::detail::NewTestPartResultCheckHelper::
            Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
            ::count((Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
                     *)local_218);
    if (iVar2 < 1) {
      local_40 = 0;
    }
    else {
      local_40 = 5;
    }
    iutest::detail::NewTestPartResultCheckHelper::
    Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
    ::~Counter((Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
                *)local_218);
    if (local_40 != 0) goto LAB_003c26f3;
  }
  else {
LAB_003c26f3:
    memset(&local_558,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_558);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_failure_checker_2.field_0x18,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
               ,0x27,
               "\nExpected: ::iutest::AssertionHelper(\"/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp\", 39, \"Succeeded.\\n\", ::iutest::TestPartResult::kSuccess) = ::iutest::AssertionHelper::Fixed() doesn\'t generate new fatal failure.\n  Actual: it does."
               ,kNonFatalFailure);
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker_2.field_0x18,&local_558);
    iutest::AssertionHelper::~AssertionHelper
              ((AssertionHelper *)&iutest_failure_checker_2.field_0x18);
    iutest::AssertionHelper::Fixed::~Fixed(&local_558);
  }
  iutest::detail::AlwaysZero();
  bVar1 = iutest::detail::AlwaysTrue();
  if (bVar1) {
    iutest::detail::NewTestPartResultCheckHelper::
    Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
    ::Counter((Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
               *)local_5a8);
    bVar1 = iutest::detail::AlwaysTrue();
    if (bVar1) {
      NoFatalFailureTest_Subroutine();
    }
    iVar2 = iutest::detail::NewTestPartResultCheckHelper::
            Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
            ::count((Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
                     *)local_5a8);
    if (iVar2 < 1) {
      local_40 = 0;
    }
    else {
      local_40 = 7;
    }
    iutest::detail::NewTestPartResultCheckHelper::
    Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
    ::~Counter((Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
                *)local_5a8);
    if (local_40 == 0) goto LAB_003c2900;
  }
  memset(&local_730,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_730);
  iutest::AssertionHelper::AssertionHelper
            ((AssertionHelper *)&iutest_failure_checker_3.field_0x18,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
             ,0x28,
             "\nExpected: NoFatalFailureTest_Subroutine() doesn\'t generate new fatal failure.\n  Actual: it does."
             ,kNonFatalFailure);
  iutest::AssertionHelper::operator=
            ((AssertionHelper *)&iutest_failure_checker_3.field_0x18,&local_730);
  iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_failure_checker_3.field_0x18)
  ;
  iutest::AssertionHelper::Fixed::~Fixed(&local_730);
LAB_003c2900:
  iutest::detail::AlwaysZero();
  bVar1 = iutest::detail::AlwaysTrue();
  if (bVar1) {
    iutest::detail::NewTestPartResultCheckHelper::
    Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
    ::Counter((Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
               *)local_780);
    bVar1 = iutest::detail::AlwaysTrue();
    if (bVar1) {
      memset(&local_908,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_908);
      iutest::AssertionHelper::AssertionHelper
                (&local_938,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
                 ,0x29,"Succeeded.\n",kSuccess);
      iutest::AssertionHelper::operator=(&local_938,&local_908);
      iutest::AssertionHelper::~AssertionHelper(&local_938);
      iutest::AssertionHelper::Fixed::~Fixed(&local_908);
    }
    iVar2 = iutest::detail::NewTestPartResultCheckHelper::
            Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
            ::count((Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
                     *)local_780);
    if (iVar2 < 1) {
      local_40 = 0;
    }
    else {
      local_40 = 9;
    }
    iutest::detail::NewTestPartResultCheckHelper::
    Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
    ::~Counter((Counter<iutest::detail::NewTestPartResultCheckHelper::CondEq<(iutest::TestPartResult::Type)2>,_iutest::detail::DefaultGlobalTestPartResultReporter>
                *)local_780);
    if (local_40 == 0) {
      return;
    }
  }
  memset(&local_ac0,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_ac0);
  iutest::AssertionHelper::AssertionHelper
            (&local_af0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
             ,0x29,
             "\nExpected: { ::iutest::AssertionHelper(\"/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp\", 41, \"Succeeded.\\n\", ::iutest::TestPartResult::kSuccess) = ::iutest::AssertionHelper::Fixed(); } doesn\'t generate new fatal failure.\n  Actual: it does."
             ,kNonFatalFailure);
  iutest::AssertionHelper::operator=(&local_af0,&local_ac0);
  iutest::AssertionHelper::~AssertionHelper(&local_af0);
  iutest::AssertionHelper::Fixed::~Fixed(&local_ac0);
  return;
}

Assistant:

IUTEST(NoFatalFailureTest, Expect)
{
    IUTEST_EXPECT_NO_FATAL_FAILURE(;);
    IUTEST_EXPECT_NO_FATAL_FAILURE(IUTEST_SUCCEED());
    IUTEST_EXPECT_NO_FATAL_FAILURE(NoFatalFailureTest_Subroutine());
    IUTEST_EXPECT_NO_FATAL_FAILURE({ IUTEST_SUCCEED(); });
}